

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pstack::Elf::Object::findSymbolByAddress_abi_cxx11_
          (optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Object *this,Addr addr,int type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  SymbolSection *pSVar5;
  Section *pSVar6;
  element_type *peVar7;
  Object *local_100;
  anon_class_48_6_dc1cbea5 findSym;
  Addr addr_local;
  Sym sym;
  string name;
  undefined1 auStack_88 [4];
  int type_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined1 auStack_78 [8];
  shared_ptr<const_pstack::LzmaReader> reader;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_type local_50;
  Elf64_Xword EStack_48;
  bool local_33;
  undefined1 local_32;
  char local_31;
  bool haveExactZeroSizeMatch;
  
  findSym.type = (int *)&findSym.haveExactZeroSizeMatch;
  findSym.this = (Object *)((long)&name.field_2 + 0xc);
  findSym.name = (string *)&local_31;
  local_31 = '\0';
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  findSym.addr = &addr_local;
  findSym.sym = (Sym *)&sym.st_size;
  local_100 = this;
  findSym.haveExactZeroSizeMatch = (bool *)addr;
  sym.st_size = (Elf64_Xword)&name._M_string_length;
  name.field_2._12_4_ = type;
  pSVar5 = getSymtab(this,&this->debugSymbols_,".symtab",2);
  bVar4 = findSymbolByAddress[abi:cxx11](unsigned_long,int)::$_0::operator()
                    ((__0 *)&local_100,pSVar5);
  if (bVar4) {
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sym.st_value;
    auStack_78._4_4_ = addr_local._4_4_;
    auStack_78._0_4_ = (undefined4)addr_local;
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         sym.st_name;
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
         sym.st_info;
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._5_1_ =
         sym.st_other;
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
         sym.st_shndx;
    local_60._M_allocated_capacity = (size_type)&local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,sym.st_size,name._M_dataplus._M_p + sym.st_size);
  }
  else {
    pSVar5 = getSymtab(this,&this->dynamicSymbols_,".dynsym",0xb);
    bVar4 = findSymbolByAddress[abi:cxx11](unsigned_long,int)::$_0::operator()
                      ((__0 *)&local_100,pSVar5);
    if (bVar4) {
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sym.st_value;
      auStack_78._4_4_ = addr_local._4_4_;
      auStack_78._0_4_ = (undefined4)addr_local;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           sym.st_name;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
           sym.st_info;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._5_1_ =
           sym.st_other;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           sym.st_shndx;
      local_60._M_allocated_capacity = (size_type)&local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,sym.st_size,name._M_dataplus._M_p + sym.st_size);
    }
    else {
      peVar7 = (this->debugData).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (peVar7 == (element_type *)0x0) {
        p_Var1 = &reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        auStack_78 = (undefined1  [8])p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_78,".gnu_debugdata","");
        pSVar6 = getSection(this,(string *)auStack_78,1);
        if (auStack_78 != (undefined1  [8])p_Var1) {
          operator_delete((void *)auStack_78,
                          (ulong)((long)&(reader.
                                          super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if ((pSVar6->shdr).sh_type != 0) {
          Section::io((Section *)auStack_88);
          std::__shared_ptr<pstack::LzmaReader_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<pstack::LzmaReader>,std::shared_ptr<pstack::Reader_const>>
                    ((__shared_ptr<pstack::LzmaReader_const,(__gnu_cxx::_Lock_policy)2> *)auStack_78
                     ,(allocator<pstack::LzmaReader> *)&local_32,
                     (shared_ptr<const_pstack::Reader> *)auStack_88);
          if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
          }
          local_33 = true;
          std::__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<pstack::Elf::Object>,pstack::Context&,std::shared_ptr<pstack::LzmaReader_const>&,bool>
                    ((__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2> *)auStack_88,
                     (allocator<pstack::Elf::Object> *)&local_32,this->context,
                     (shared_ptr<const_pstack::LzmaReader> *)auStack_78,&local_33);
          _Var3._M_pi = _Stack_80._M_pi;
          peVar7 = _auStack_88;
          _auStack_88 = (element_type *)0x0;
          _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (this->debugData).
                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (this->debugData).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar7;
          (this->debugData).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Var3._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(reader.
                       super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._4_4_,
                       (Elf64_Word)
                       reader.
                       super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(reader.
                                super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr._4_4_,
                                (Elf64_Word)
                                reader.
                                super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr));
          }
        }
        peVar7 = (this->debugData).
                 super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar7 != (element_type *)0x0) goto LAB_0015a661;
      }
      else {
LAB_0015a661:
        findSymbolByAddress_abi_cxx11_
                  (__return_storage_ptr__,peVar7,(Addr)findSym.haveExactZeroSizeMatch,
                   name.field_2._12_4_);
        if ((__return_storage_ptr__->
            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_engaged != false) goto LAB_0015a703;
      }
      if (local_31 != '\x01') {
        addr_local._4_4_ = addr_local._4_4_ & 0xffff;
        (__return_storage_ptr__->
        super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_engaged = false;
        goto LAB_0015a703;
      }
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sym.st_value;
      auStack_78._4_4_ = addr_local._4_4_;
      auStack_78._0_4_ = (undefined4)addr_local;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           sym.st_name;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
           sym.st_info;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._5_1_ =
           sym.st_other;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           sym.st_shndx;
      local_60._M_allocated_capacity = (size_type)&local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,sym.st_size,name._M_dataplus._M_p + sym.st_size);
    }
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           )._M_payload.
           super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_payload + 0x10) =
       reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  *(undefined1 (*) [8])
   &(__return_storage_ptr__->
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload = auStack_78;
  *(ulong *)((long)&(__return_storage_ptr__->
                    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_payload + 8) =
       CONCAT44(reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,
                (Elf64_Word)
                reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr);
  paVar2 = &(__return_storage_ptr__->
            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload._M_value.second.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(__return_storage_ptr__->
               super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_payload + 0x18) = paVar2;
  if ((size_type *)local_60._0_8_ == &local_50) {
    paVar2->_M_allocated_capacity = local_50;
    *(Elf64_Xword *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_payload._M_value.second.field_2 + 8) = EStack_48;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.second._M_dataplus._M_p = (pointer)local_60._0_8_;
    (__return_storage_ptr__->
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.second.field_2._M_allocated_capacity = local_50;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_payload._M_value.second._M_string_length = local_60._8_8_;
  (__return_storage_ptr__->
  super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = true;
LAB_0015a703:
  if ((size_type *)sym.st_size != &name._M_string_length) {
    operator_delete((void *)sym.st_size,
                    CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<Sym, string>>
Object::findSymbolByAddress(Addr addr, int type)
{
    /* Try to find symbols in these sections */
    bool haveExactZeroSizeMatch = false;

    Sym sym;
    std::string name;
    auto findSym = [&] (auto &table) {
        for (const auto &candidate : table) {
            if (candidate.st_shndx >= sectionHeaders.size())
                continue;
            if (type != STT_NOTYPE && ELF_ST_TYPE(candidate.st_info) != type)
                continue;
            if (candidate.st_value > addr)
                continue;
            if (candidate.st_size + candidate.st_value <= addr) {
                if (candidate.st_size == 0 && candidate.st_value == addr) {
                    sym = candidate;
                    name = table.name(candidate);
                    haveExactZeroSizeMatch = true;
                }
                continue;
            }
            auto &sec = sectionHeaders[candidate.st_shndx];
            if ((sec->shdr.sh_flags & SHF_ALLOC) == 0)
                continue;
            sym = candidate;
            name = table.name(candidate);
            return true;
        }
        sym.st_shndx = SHN_UNDEF;
        return false;
    };
    if (findSym(*debugSymbols()))
        return std::make_pair( sym, name );
    if (findSym(*dynamicSymbols()))
        return std::make_pair( sym, name );
    // .gnu_debugdata is a separate LZMA-compressed ELF image with just
    // a symbol table.
    if (debugData == nullptr) {
#ifdef WITH_LZMA
        auto &gnu_debugdata = getSection(".gnu_debugdata", SHT_PROGBITS );
        if (gnu_debugdata) {
           auto reader = make_shared<const LzmaReader>(gnu_debugdata.io());
           debugData = make_shared<Object>(context, reader, true);
        }
#else
        static bool warned = false;
        if (!warned && context.debug) {
            *context.debug << "warning: no compiled support for LZMA - "
                "can't decode debug data in " << *io << "\n";
            warned = true;
        }
#endif
    }

    if (debugData) {
        auto debugSym = debugData->findSymbolByAddress(addr, type);
        if (debugSym)
            return debugSym;
    }

    if (haveExactZeroSizeMatch)
        return std::make_pair( sym, name );
    sym.st_shndx = SHN_UNDEF;
    return std::nullopt;
}